

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-projection.c
# Opt level: O3

_Bool borg_offset_projectable(wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2)

{
  uint8_t uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  _Bool _Var4;
  uint uVar5;
  wchar_t x;
  wchar_t y;
  wchar_t local_3c;
  wchar_t local_38;
  wchar_t local_34;
  
  uVar5 = 0xffffffff;
  local_3c = x1;
  local_38 = y1;
  local_34 = x1;
  do {
    wVar3 = local_38;
    wVar2 = local_3c;
    uVar1 = borg_grids[local_38][local_3c].feat;
    if (uVar5 == 0xffffffff) {
      if (uVar1 == '\x18') {
        return false;
      }
    }
    else {
      if (uVar1 == '\0') {
        return false;
      }
      if (uVar1 == '\x18') {
        return false;
      }
      _Var4 = borg_cave_floor_grid(borg_grids[local_38] + local_3c);
      if (!_Var4) {
        return false;
      }
    }
    if (wVar3 == y2 && wVar2 == x2) {
      return true;
    }
    borg_inc_motion(&local_38,&local_3c,y1,local_34,y2,x2);
    uVar5 = uVar5 + 1;
  } while (uVar5 < z_info->max_range);
  return false;
}

Assistant:

bool borg_offset_projectable(int y1, int x1, int y2, int x2)
{
    int dist, y, x;

    borg_grid *ag;

    /* Start at the initial location */
    y = y1;
    x = x1;

    /* Simulate the spell/missile path */
    for (dist = 0; dist <= z_info->max_range; dist++) {
        /* Get the grid */
        ag = &borg_grids[y][x];

        /* Assume all unknown grids are walls. */
        if ((dist) && (ag->feat == FEAT_NONE))
            break;

        /* Never pass through rubble */
        if (ag->feat == FEAT_PASS_RUBBLE)
            break;

        /* Never pass through walls/doors */
        if (dist && (!borg_cave_floor_grid(ag)))
            break;

        /* Check for arrival at "final target" */
        if ((x == x2) && (y == y2))
            return true;

        /* Calculate the new location */
        borg_inc_motion(&y, &x, y1, x1, y2, x2);
    }

    /* Assume obstruction */
    return false;
}